

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O2

int Jf_CutIsContainedOrder(int *pBase,int *pCut)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar3 = *pBase & 0xf;
  uVar4 = *pCut & 0xf;
  if (uVar3 == uVar4) {
    uVar5 = 0;
    do {
      if (uVar3 == uVar5) {
        return 1;
      }
      lVar1 = uVar5 + 1;
      lVar2 = uVar5 + 1;
      uVar5 = uVar5 + 1;
    } while (pBase[lVar1] == pCut[lVar2]);
  }
  else {
    if (uVar3 <= uVar4) {
      __assert_fail("nSizeB > nSizeC",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                    ,0x236,"int Jf_CutIsContainedOrder(int *, int *)");
    }
    uVar6 = 1;
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      if (pCut[(int)uVar6] < pBase[uVar5 + 1]) {
        return 0;
      }
      if (pBase[uVar5 + 1] == pCut[(int)uVar6]) {
        if (uVar6 == uVar4) {
          return 1;
        }
        uVar6 = uVar6 + 1;
      }
    }
  }
  return 0;
}

Assistant:

static inline int Jf_CutIsContainedOrder( int * pBase, int * pCut ) // check if pCut is contained pBase
{
    int nSizeB = Jf_CutSize(pBase);
    int nSizeC = Jf_CutSize(pCut);
    int i, k;
    if ( nSizeB == nSizeC )
    {
        for ( i = 1; i <= nSizeB; i++ )
            if ( pBase[i] != pCut[i] )
                return 0;
        return 1;
    }
    assert( nSizeB > nSizeC ); 
    for ( i = k = 1; i <= nSizeB; i++ )
    {
        if ( pBase[i] > pCut[k] )
            return 0;
        if ( pBase[i] == pCut[k] )
        {
            if ( k++ == nSizeC )
                return 1;
        }
    }
    return 0;
}